

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Flow3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  uint local_48;
  int fVerbose;
  int c;
  int fUseLutLib;
  int fUseMfs;
  int fMinAve;
  int fBalance;
  int nCutNum;
  int nLutSize;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fBalance = 6;
  fMinAve = 8;
  fUseMfs = 0;
  fUseLutLib = 0;
  c = 1;
  fVerbose = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
LAB_002aff1b:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"KCbtmlvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Flow3(): There is no AIG.\n");
        return 1;
      }
      if ((fVerbose != 0) && (pvVar2 = Abc_FrameReadLibLut(), pvVar2 == (void *)0x0)) {
        Abc_Print(-1,"Abc_CommandAbc9Flow3(): Please enter LUT library using \'read_lut\'.\n");
        return 1;
      }
      Gia_ManPerformFlow3(fBalance,fMinAve,fUseMfs,fUseLutLib,c,fVerbose,local_48);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002b00fa;
      }
      fMinAve = atoi(argv[globalUtilOptind]);
      iVar1 = fMinAve;
      break;
    default:
      goto LAB_002b00fa;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_002b00fa;
      }
      fBalance = atoi(argv[globalUtilOptind]);
      iVar1 = fBalance;
      break;
    case 0x62:
      fUseMfs = fUseMfs ^ 1;
      goto LAB_002aff1b;
    case 0x68:
      goto LAB_002b00fa;
    case 0x6c:
      fVerbose = fVerbose ^ 1;
      goto LAB_002aff1b;
    case 0x6d:
      c = c ^ 1;
      goto LAB_002aff1b;
    case 0x74:
      fUseLutLib = fUseLutLib ^ 1;
      goto LAB_002aff1b;
    case 0x76:
      local_48 = local_48 ^ 1;
      goto LAB_002aff1b;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_002b00fa:
      Abc_Print(-2,"usage: &flow3 [-KC num] [-btmlvh]\n");
      Abc_Print(-2,"\t         integration optimization and mapping flow\n");
      Abc_Print(-2,"\t-K num : the number of LUT inputs (LUT size) [default = %d]\n",
                (ulong)(uint)fBalance);
      Abc_Print(-2,"\t-C num : the number of cuts at a node [default = %d]\n",(ulong)(uint)fMinAve);
      pcVar3 = "no";
      if (fUseMfs != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggle using SOP balancing during synthesis [default = %s]\n",pcVar3)
      ;
      pcVar3 = "no";
      if (fUseLutLib != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle minimizing average (not maximum) level [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (c != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggle using \"mfs2\" in the script [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (fVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-l     : toggle using previously entered LUT library [default = %s]\n",pcVar3)
      ;
      pcVar3 = "no";
      if (local_48 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Flow3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManPerformFlow3( int nLutSize, int nCutNum, int fBalance, int fMinAve, int fUseMfs, int fUseLutLib, int fVerbose );
    int nLutSize    =  6;
    int nCutNum     =  8;
    int fBalance    =  0;
    int fMinAve     =  0;
    int fUseMfs     =  1;
    int fUseLutLib  =  0;
    int c, fVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCbtmlvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
         case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutNum < 0 )
                goto usage;
            break;
        case 'b':
            fBalance ^= 1;
            break;
        case 't':
            fMinAve ^= 1;
            break;
        case 'm':
            fUseMfs ^= 1;
            break;
        case 'l':
            fUseLutLib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Flow3(): There is no AIG.\n" );
        return 1;
    }
    if ( fUseLutLib && Abc_FrameReadLibLut() == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Flow3(): Please enter LUT library using \'read_lut\'.\n" );
        return 1;
    }
    Gia_ManPerformFlow3( nLutSize, nCutNum, fBalance, fMinAve, fUseMfs, fUseLutLib, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &flow3 [-KC num] [-btmlvh]\n" );
    Abc_Print( -2, "\t         integration optimization and mapping flow\n" );
    Abc_Print( -2, "\t-K num : the number of LUT inputs (LUT size) [default = %d]\n",           nLutSize );
    Abc_Print( -2, "\t-C num : the number of cuts at a node [default = %d]\n",                  nCutNum );
    Abc_Print( -2, "\t-b     : toggle using SOP balancing during synthesis [default = %s]\n",   fBalance? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle minimizing average (not maximum) level [default = %s]\n", fMinAve? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using \"mfs2\" in the script [default = %s]\n",           fUseMfs? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle using previously entered LUT library [default = %s]\n",   fUseLutLib? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",           fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}